

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

Task * AI::create_ChaseLastKnownPosition(void)

{
  Task *in_RDI;
  int in_R8D;
  anon_class_1_0_00000001 local_770;
  anon_class_1_0_00000001 local_76f;
  anon_class_1_0_00000001 local_76e;
  anon_class_1_0_00000001 local_76d;
  value_type local_76c;
  undefined8 local_768;
  undefined4 local_760;
  undefined4 local_754;
  undefined4 uStack_750;
  undefined4 local_74c;
  undefined1 local_748 [8];
  Task moveToLastKnownLocation;
  Task bark;
  value_type local_50 [5];
  allocator<char> local_39;
  string local_38;
  byte local_11;
  Task *chaseLastKnownPosition;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"chaseLastKnownPosition",&local_39);
  Task::Task(in_RDI,&local_38,Compound);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  in_RDI->identifier = ChaseLastKnownPosition;
  local_50[0] = Player_LastKnownLocation;
  std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::push_back
            (&(in_RDI->preconditions).consumableVectors,local_50);
  bark.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._0_4_ = 3;
  bark.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._4_1_ = 0;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::push_back
            ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)in_RDI,
             (value_type *)
             &bark.parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  create_Bark((Task *)&moveToLastKnownLocation.parameters.flags.
                       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                       _M_end_of_storage,LostSightOfPlayer);
  local_754 = 0;
  uStack_750 = 0x3f800000;
  local_74c = 0;
  local_760 = 0;
  local_768 = 0x3f80000000000000;
  create_MoveToDestination
            ((Task *)local_748,(AI *)0x1,320.0,(Vector3)ZEXT812(0x3f80000000000000),1.0,true,true,
             in_R8D);
  local_76c = Player_LastKnownLocation;
  std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::push_back
            ((vector<ConsumableFact,_std::allocator<ConsumableFact>_> *)
             &moveToLastKnownLocation.preconditions.consumableValues.
              super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_76c);
  std::function<void(AI::Task&,AI::WorldState&,AI::WorldQuerier_const&)>::operator=
            ((function<void(AI::Task&,AI::WorldState&,AI::WorldQuerier_const&)> *)
             &moveToLastKnownLocation.action,&local_76d);
  std::function<void(AI::WorldState&,AI::WorldQuerier_const&,AI::Task&)>::operator=
            ((function<void(AI::WorldState&,AI::WorldQuerier_const&,AI::Task&)> *)
             &moveToLastKnownLocation.finally._M_invoker,&local_76e);
  std::function<void(AI::WorldState&,AI::Task&)>::operator=
            ((function<void(AI::WorldState&,AI::Task&)> *)&moveToLastKnownLocation.setup._M_invoker,
             &local_76f);
  std::function<void(AI::WorldState&)>::operator=
            ((function<void(AI::WorldState&)> *)&moveToLastKnownLocation.finish._M_invoker,
             &local_770);
  Task::addSubtask(in_RDI,(Task *)&moveToLastKnownLocation.parameters.flags.
                                   super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_end_of_storage);
  Task::addSubtask(in_RDI,(Task *)local_748);
  local_11 = 1;
  Task::~Task((Task *)local_748);
  Task::~Task((Task *)&moveToLastKnownLocation.parameters.flags.
                       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                       _M_end_of_storage);
  if ((local_11 & 1) == 0) {
    Task::~Task(in_RDI);
  }
  return in_RDI;
}

Assistant:

Task create_ChaseLastKnownPosition()
	{
		Task chaseLastKnownPosition {"chaseLastKnownPosition", TaskType::Compound};
		chaseLastKnownPosition.identifier = TaskIdentifier::ChaseLastKnownPosition;
		chaseLastKnownPosition.preconditions.consumableVectors.push_back(ConsumableFact::Player_LastKnownLocation);
		chaseLastKnownPosition.preconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, false});

		auto bark = create_Bark(Bark::LostSightOfPlayer);	

		auto moveToLastKnownLocation = create_MoveToDestination(320.f, {0.f, 1.f, 0.f});
		moveToLastKnownLocation.preconditions.consumableVectors.push_back(ConsumableFact::Player_LastKnownLocation);
		moveToLastKnownLocation.setup = [=](Task& task, WorldState& state, const WorldQuerier&)
		{
			state.current.vectors[WorldStateIdentifier::Destination] = state.facts.vectors[ConsumableFact::Player_LastKnownLocation].value;
		};
		moveToLastKnownLocation.loop = [](WorldState& state, WorldQuerier const&, Task& task)
		{
			/*auto& target = state.current.vectors[WorldStateIdentifier::PlayerPosition];
			auto& start = state.current.vectors[WorldStateIdentifier::CurrentPosition];
			auto xAxis = target - start;
			xAxis.normalize();
			
			state.animationDriver->isHeadTracking = true;
			state.animationDriver->headRotation = 				
				(FRotationMatrix::MakeFromXZ(xAxis, {0.f, 0.f, 1.f}).ToQuat() * FQuat(FRotator(90, 0, 0)) * FQuat(FRotator(0.f, 0.f, 90.f))).Rotator();
			*/
		};

		moveToLastKnownLocation.finish = [](WorldState& state, Task& task)
		{
			state.consumeFactVector(ConsumableFact::Player_LastKnownLocation);
		};

		moveToLastKnownLocation.finally = [](WorldState& state)
		{
			//state.animationDriver->isHeadTracking = false;
		};
		
		chaseLastKnownPosition.addSubtask(bark);
		chaseLastKnownPosition.addSubtask(moveToLastKnownLocation);

		return chaseLastKnownPosition;
	}